

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O0

void ZSTD_optLdm_maybeAddMatch
               (ZSTD_match_t *matches,U32 *nbMatches,ZSTD_optLdm_t *optLdm,U32 currPosInBlock)

{
  U32 UVar1;
  uint uVar2;
  U32 candidateOffCode;
  U32 candidateMatchLength;
  U32 posDiff;
  U32 currPosInBlock_local;
  ZSTD_optLdm_t *optLdm_local;
  U32 *nbMatches_local;
  ZSTD_match_t *matches_local;
  
  uVar2 = (optLdm->endPosInBlock - optLdm->startPosInBlock) -
          (currPosInBlock - optLdm->startPosInBlock);
  UVar1 = optLdm->offset;
  if ((((optLdm->startPosInBlock <= currPosInBlock) && (currPosInBlock < optLdm->endPosInBlock)) &&
      (2 < uVar2)) &&
     ((*nbMatches == 0 || ((matches[*nbMatches - 1].len < uVar2 && (*nbMatches < 0x1000)))))) {
    matches[*nbMatches].len = uVar2;
    matches[*nbMatches].off = UVar1 + 2;
    *nbMatches = *nbMatches + 1;
  }
  return;
}

Assistant:

static void ZSTD_optLdm_maybeAddMatch(ZSTD_match_t* matches, U32* nbMatches,
                                      ZSTD_optLdm_t* optLdm, U32 currPosInBlock) {
    U32 posDiff = currPosInBlock - optLdm->startPosInBlock;
    /* Note: ZSTD_match_t actually contains offCode and matchLength (before subtracting MINMATCH) */
    U32 candidateMatchLength = optLdm->endPosInBlock - optLdm->startPosInBlock - posDiff;
    U32 candidateOffCode = optLdm->offset + ZSTD_REP_MOVE;

    /* Ensure that current block position is not outside of the match */
    if (currPosInBlock < optLdm->startPosInBlock
      || currPosInBlock >= optLdm->endPosInBlock
      || candidateMatchLength < MINMATCH) {
        return;
    }

    if (*nbMatches == 0 || ((candidateMatchLength > matches[*nbMatches-1].len) && *nbMatches < ZSTD_OPT_NUM)) {
        DEBUGLOG(6, "ZSTD_optLdm_maybeAddMatch(): Adding ldm candidate match (offCode: %u matchLength %u) at block position=%u",
                 candidateOffCode, candidateMatchLength, currPosInBlock);
        matches[*nbMatches].len = candidateMatchLength;
        matches[*nbMatches].off = candidateOffCode;
        (*nbMatches)++;
    }
}